

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::cpp::QualifiedExtensionName_abi_cxx11_
          (string *__return_storage_ptr__,cpp *this,FieldDescriptor *d,Options *options)

{
  bool bVar1;
  LogMessage *pLVar2;
  FileDescriptor *this_00;
  FieldDescriptor *d_00;
  Options *in_R9;
  string_view name;
  string local_90;
  undefined1 local_70 [16];
  byte local_49;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  LogMessageFatal local_38 [23];
  Voidify local_21;
  FieldDescriptor *local_20;
  Options *options_local;
  FieldDescriptor *d_local;
  
  local_20 = d;
  options_local = (Options *)this;
  d_local = (FieldDescriptor *)__return_storage_ptr__;
  bVar1 = FieldDescriptor::is_extension((FieldDescriptor *)this);
  local_49 = 0;
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_48,"d->is_extension()");
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_38,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/compiler/cpp/helpers.cc"
               ,0x1be,local_48._M_len,local_48._M_str);
    local_49 = 1;
    pLVar2 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_38);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_21,pLVar2);
  }
  if ((local_49 & 1) != 0) {
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_38);
  }
  this_00 = FieldDescriptor::file((FieldDescriptor *)options_local);
  ExtensionName_abi_cxx11_(&local_90,(cpp *)options_local,d_00);
  local_70 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_90);
  name._M_str = (char *)local_20;
  name._M_len = local_70._8_8_;
  QualifiedFileLevelSymbol_abi_cxx11_
            (__return_storage_ptr__,(cpp *)this_00,local_70._0_8_,name,in_R9);
  std::__cxx11::string::~string((string *)&local_90);
  return __return_storage_ptr__;
}

Assistant:

std::string QualifiedExtensionName(const FieldDescriptor* d,
                                   const Options& options) {
  ABSL_DCHECK(d->is_extension());
  return QualifiedFileLevelSymbol(d->file(), ExtensionName(d), options);
}